

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nesintf.c
# Opt level: O0

void nes_set_chip_option_nsfplay(void *chip,UINT32 NesOptions)

{
  undefined1 local_21;
  UINT8 CurOpt;
  NESAPU_INF *info;
  UINT32 NesOptions_local;
  void *chip_local;
  
  for (local_21 = 0; local_21 < 2; local_21 = local_21 + 1) {
    NES_APU_np_SetOption
              (*(void **)((long)chip + 8),(uint)local_21,NesOptions >> (local_21 & 0x1f) & 1);
    NES_DMC_np_SetOption
              (*(void **)((long)chip + 0x10),(uint)local_21,NesOptions >> (local_21 & 0x1f) & 1);
  }
  for (; local_21 < 4; local_21 = local_21 + 1) {
    NES_APU_np_SetOption
              (*(void **)((long)chip + 8),(uint)local_21,NesOptions >> (local_21 & 0x1f) & 1);
  }
  for (; local_21 < 10; local_21 = local_21 + 1) {
    NES_DMC_np_SetOption
              (*(void **)((long)chip + 0x10),local_21 - 2,NesOptions >> (local_21 & 0x1f) & 1);
  }
  if (*(long *)((long)chip + 0x18) != 0) {
    nes_set_chip_option_fds((NESAPU_INF *)chip,NesOptions);
  }
  return;
}

Assistant:

static void nes_set_chip_option_nsfplay(void* chip, UINT32 NesOptions)
{
	NESAPU_INF* info = (NESAPU_INF*)chip;
	UINT8 CurOpt;
	
	// shared APU/DMC options
	for (CurOpt = 0; CurOpt < 2; CurOpt ++)
	{
		NES_APU_np_SetOption(info->chip_apu, CurOpt, (NesOptions >> CurOpt) & 0x01);
		NES_DMC_np_SetOption(info->chip_dmc, CurOpt, (NesOptions >> CurOpt) & 0x01);
	}
	// APU-only options
	for (; CurOpt < 4; CurOpt ++)
		NES_APU_np_SetOption(info->chip_apu, CurOpt-2+2, (NesOptions >> CurOpt) & 0x01);
	// DMC-only options
	for (; CurOpt < 10; CurOpt ++)
		NES_DMC_np_SetOption(info->chip_dmc, CurOpt-4+2, (NesOptions >> CurOpt) & 0x01);
	
#ifdef EC_NES_NSFP_FDS
	if (info->chip_fds != NULL)
		nes_set_chip_option_fds(info, NesOptions);
#endif
	
	return;
}